

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O1

int duckdb_brotli::BrotliDecoderHuffmanTreeGroupInit
              (BrotliDecoderStateInternal *s,HuffmanTreeGroup *group,uint64_t alphabet_size_max,
              uint64_t alphabet_size_limit,uint64_t ntrees)

{
  HuffmanCode **ppHVar1;
  
  ppHVar1 = (HuffmanCode **)
            (*s->alloc_func)(s->memory_manager_opaque,(alphabet_size_limit * 4 + 0x5e8) * ntrees);
  group->alphabet_size_max = (uint16_t)alphabet_size_max;
  group->alphabet_size_limit = (uint16_t)alphabet_size_limit;
  group->num_htrees = (uint16_t)ntrees;
  group->htrees = ppHVar1;
  group->codes = (HuffmanCode *)(ppHVar1 + ntrees);
  return (int)(ppHVar1 != (HuffmanCode **)0x0);
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliDecoderHuffmanTreeGroupInit(BrotliDecoderState* s,
    HuffmanTreeGroup* group, brotli_reg_t alphabet_size_max,
    brotli_reg_t alphabet_size_limit, brotli_reg_t ntrees) {
  /* 376 = 256 (1-st level table) + 4 + 7 + 15 + 31 + 63 (2-nd level mix-tables)
     This number is discovered "unlimited" "enough" calculator; it is actually
     a wee bigger than required in several cases (especially for alphabets with
     less than 16 symbols). */
  const size_t max_table_size = alphabet_size_limit + 376;
  const size_t code_size = sizeof(HuffmanCode) * ntrees * max_table_size;
  const size_t htree_size = sizeof(HuffmanCode*) * ntrees;
  /* Pointer alignment is, hopefully, wider than sizeof(HuffmanCode). */
  HuffmanCode** p = (HuffmanCode**)BROTLI_DECODER_ALLOC(s,
      code_size + htree_size);
  group->alphabet_size_max = (uint16_t)alphabet_size_max;
  group->alphabet_size_limit = (uint16_t)alphabet_size_limit;
  group->num_htrees = (uint16_t)ntrees;
  group->htrees = p;
  group->codes = (HuffmanCode*)(&p[ntrees]);
  return !!p;
}